

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O0

void __thiscall
std::pmr::local_malloc_free_resource::malloc_free_resource::~malloc_free_resource
          (malloc_free_resource *this)

{
  malloc_free_resource *this_local;
  
  std::pmr::memory_resource::~memory_resource(&this->super_memory_resource);
  return;
}

Assistant:

[[nodiscard]] void *
            do_allocate(size_t bytes, size_t alignment) override
        {
            // While this class is local, there is no need to check the
            // alignment, as we never ask for overaligned memory
            //if (alignment > alignof(max_align_t)) {
            //    throw bad_alloc();
            //}
            void *rv = malloc(bytes);
            if (nullptr == rv) {
                throw bad_alloc();
            }
            return rv;
        }